

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_path_challenge_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *puVar1;
  int iVar2;
  st_quicly_pending_path_challenge_t *psVar3;
  
  puVar1 = state->src;
  iVar2 = 0x20007;
  if (7 < (long)state->end - (long)puVar1) {
    state->src = puVar1 + 8;
    psVar3 = (st_quicly_pending_path_challenge_t *)malloc(0x18);
    if (psVar3 == (st_quicly_pending_path_challenge_t *)0x0) {
      iVar2 = 0x201;
    }
    else {
      psVar3->next = (st_quicly_pending_path_challenge_t *)0x0;
      psVar3->is_response = '\x01';
      *(undefined8 *)psVar3->data = *(undefined8 *)puVar1;
      *(conn->egress).path_challenge.tail_ref = psVar3;
      (conn->egress).path_challenge.tail_ref = (st_quicly_pending_path_challenge_t **)psVar3;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int handle_path_challenge_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_path_challenge_frame_t frame;
    int ret;

    if ((ret = quicly_decode_path_challenge_frame(&state->src, state->end, &frame)) != 0)
        return ret;
    return schedule_path_challenge_frame(conn, 1, frame.data);
}